

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_drawing.h
# Opt level: O0

void core::image::draw_circle<unsigned_char>
               (Image<unsigned_char> *image,int x,int y,int radius,uchar *color)

{
  int iVar1;
  int iVar2;
  uchar *puVar3;
  int local_4c;
  int local_48;
  int yi;
  int xi;
  int ddf_y;
  int ddf_x;
  int f;
  uchar *ptr;
  int row_stride;
  int chans;
  uchar *color_local;
  int radius_local;
  int y_local;
  int x_local;
  Image<unsigned_char> *image_local;
  
  iVar1 = ImageBase::channels((ImageBase *)image);
  iVar2 = ImageBase::width((ImageBase *)image);
  iVar2 = iVar2 * iVar1;
  puVar3 = Image<unsigned_char>::at(image,x,y,0);
  std::copy<unsigned_char_const*,unsigned_char*>
            (color,color + iVar1,puVar3 + -(long)(radius * iVar2));
  std::copy<unsigned_char_const*,unsigned_char*>
            (color,color + iVar1,puVar3 + -(long)(radius * iVar1));
  std::copy<unsigned_char_const*,unsigned_char*>(color,color + iVar1,puVar3 + radius * iVar1);
  std::copy<unsigned_char_const*,unsigned_char*>(color,color + iVar1,puVar3 + radius * iVar2);
  ddf_y = 1 - radius;
  xi = 1;
  yi = radius * -2;
  local_48 = 0;
  local_4c = radius;
  while (local_48 < local_4c) {
    if (-1 < ddf_y) {
      local_4c = local_4c + -1;
      yi = yi + 2;
      ddf_y = yi + ddf_y;
    }
    local_48 = local_48 + 1;
    xi = xi + 2;
    ddf_y = xi + ddf_y;
    std::copy<unsigned_char_const*,unsigned_char*>
              (color,color + iVar1,puVar3 + (long)(local_4c * iVar2) + (long)(local_48 * iVar1));
    std::copy<unsigned_char_const*,unsigned_char*>
              (color,color + iVar1,puVar3 + ((long)(local_4c * iVar2) - (long)(local_48 * iVar1)));
    std::copy<unsigned_char_const*,unsigned_char*>
              (color,color + iVar1,puVar3 + ((long)(local_48 * iVar1) - (long)(local_4c * iVar2)));
    std::copy<unsigned_char_const*,unsigned_char*>
              (color,color + iVar1,puVar3 + (-(long)(local_4c * iVar2) - (long)(local_48 * iVar1)));
    std::copy<unsigned_char_const*,unsigned_char*>
              (color,color + iVar1,puVar3 + (long)(local_4c * iVar1) + (long)(local_48 * iVar2));
    std::copy<unsigned_char_const*,unsigned_char*>
              (color,color + iVar1,puVar3 + ((long)(local_4c * iVar1) - (long)(local_48 * iVar2)));
    std::copy<unsigned_char_const*,unsigned_char*>
              (color,color + iVar1,puVar3 + ((long)(local_48 * iVar2) - (long)(local_4c * iVar1)));
    std::copy<unsigned_char_const*,unsigned_char*>
              (color,color + iVar1,puVar3 + (-(long)(local_4c * iVar1) - (long)(local_48 * iVar2)));
  }
  return;
}

Assistant:

void
draw_circle (Image<T>& image, int x, int y, int radius, T const* color)
{
    /* http://en.wikipedia.org/wiki/Bresenham_circle */
    int const chans = image.channels();
    int const row_stride = image.width() * chans;
    T* const ptr = &image.at(x, y, 0);
    std::copy(color, color + chans, ptr - radius * row_stride);
    std::copy(color, color + chans, ptr - radius * chans);
    std::copy(color, color + chans, ptr + radius * chans);
    std::copy(color, color + chans, ptr + radius * row_stride);

    int f = 1 - radius;
    int ddf_x = 1;
    int ddf_y = -2 * radius;
    int xi = 0;
    int yi = radius;
    while (xi < yi)
    {
        if (f >= 0)
        {
            yi--;
            ddf_y += 2;
            f += ddf_y;
        }
        xi++;
        ddf_x += 2;
        f += ddf_x;

        std::copy(color, color + chans, ptr + xi * chans + yi * row_stride);
        std::copy(color, color + chans, ptr - xi * chans + yi * row_stride);
        std::copy(color, color + chans, ptr + xi * chans - yi * row_stride);
        std::copy(color, color + chans, ptr - xi * chans - yi * row_stride);
        std::copy(color, color + chans, ptr + xi * row_stride + yi * chans);
        std::copy(color, color + chans, ptr - xi * row_stride + yi * chans);
        std::copy(color, color + chans, ptr + xi * row_stride - yi * chans);
        std::copy(color, color + chans, ptr - xi * row_stride - yi * chans);
    }
}